

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void camp::test::array::copy_assignment_host_kernel(bool *passed)

{
  *passed = true;
  return;
}

Assistant:

TEST(host_array, at)
{
   camp::array<int, 2> a = {-4, 4};
   const camp::array<int, 2>& b = a;

   a.at(1) = 8;

   int resultAt0 = -1;
   int resultAt1 = -1;
   int resultAt2 = -1;
   bool exception = false;

   try {
      resultAt0 = a.at(0);
      resultAt1 = b.at(1);
      resultAt2 = a.at(2);
   }
   catch (const std::out_of_range&) {
      exception = true;
   }

   EXPECT_EQ(resultAt0, -4);
   EXPECT_EQ(resultAt1,  8);
   EXPECT_EQ(resultAt2, -1);
   EXPECT_TRUE(exception);
}